

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

bool bssl::anon_unknown_0::ConnectClientAndServer
               (UniquePtr<SSL> *out_client,UniquePtr<SSL> *out_server,SSL_CTX *client_ctx,
               SSL_CTX *server_ctx,ClientConfig *config,bool shed_handshake_config)

{
  _Head_base<0UL,_ssl_st_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  UniquePtr<SSL> client;
  UniquePtr<SSL> server;
  _Head_base<0UL,_ssl_st_*,_false> local_30;
  _Head_base<0UL,_ssl_st_*,_false> local_28;
  
  local_30._M_head_impl = (ssl_st *)0x0;
  local_28._M_head_impl = (SSL *)0x0;
  bVar2 = CreateClientAndServer
                    ((UniquePtr<SSL> *)&local_30,(UniquePtr<SSL> *)&local_28,client_ctx,server_ctx);
  if (bVar2) {
    if (config->early_data == true) {
      SSL_set_early_data_enabled(local_30._M_head_impl,1);
    }
    if ((SSL_SESSION *)config->session != (SSL_SESSION *)0x0) {
      SSL_set_session((SSL *)local_30._M_head_impl,(SSL_SESSION *)config->session);
    }
    if ((config->servername)._M_string_length != 0) {
      iVar3 = SSL_set_tlsext_host_name(local_30._M_head_impl,(config->servername)._M_dataplus._M_p);
      if (iVar3 == 0) goto LAB_001722ab;
    }
    if ((config->verify_hostname)._M_string_length != 0) {
      iVar3 = SSL_set1_host(local_30._M_head_impl,(config->verify_hostname)._M_dataplus._M_p);
      if (iVar3 == 0) goto LAB_001722ab;
      SSL_set_hostflags(local_30._M_head_impl,config->hostflags);
    }
    if (config->ca_names != (stack_st_CRYPTO_BUFFER *)0x0) {
      SSL_set0_CA_names(local_30._M_head_impl,config->ca_names);
    }
    SSL_set_shed_handshake_config(local_30._M_head_impl,(uint)shed_handshake_config);
    SSL_set_shed_handshake_config(local_28._M_head_impl,(uint)shed_handshake_config);
    bVar2 = CompleteHandshakes(local_30._M_head_impl,local_28._M_head_impl);
    _Var1._M_head_impl = local_30._M_head_impl;
    if (bVar2) {
      local_30._M_head_impl = (ssl_st *)0x0;
      std::__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)out_client,_Var1._M_head_impl);
      _Var1._M_head_impl = local_28._M_head_impl;
      local_28._M_head_impl = (SSL *)0x0;
      std::__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> *)out_server,_Var1._M_head_impl);
      bVar2 = true;
      goto LAB_001722ad;
    }
  }
LAB_001722ab:
  bVar2 = false;
LAB_001722ad:
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_28);
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_30);
  return bVar2;
}

Assistant:

static bool ConnectClientAndServer(bssl::UniquePtr<SSL> *out_client,
                                   bssl::UniquePtr<SSL> *out_server,
                                   SSL_CTX *client_ctx, SSL_CTX *server_ctx,
                                   const ClientConfig &config = ClientConfig(),
                                   bool shed_handshake_config = true) {
  bssl::UniquePtr<SSL> client, server;
  if (!CreateClientAndServer(&client, &server, client_ctx, server_ctx)) {
    return false;
  }
  if (config.early_data) {
    SSL_set_early_data_enabled(client.get(), 1);
  }
  if (config.session) {
    SSL_set_session(client.get(), config.session);
  }
  if (!config.servername.empty() &&
      !SSL_set_tlsext_host_name(client.get(), config.servername.c_str())) {
    return false;
  }
  if (!config.verify_hostname.empty()) {
    if (!SSL_set1_host(client.get(), config.verify_hostname.c_str())) {
      return false;
    }
    SSL_set_hostflags(client.get(), config.hostflags);
  }

  if (config.ca_names) {
    SSL_set0_CA_names(client.get(), config.ca_names);
  }

  SSL_set_shed_handshake_config(client.get(), shed_handshake_config);
  SSL_set_shed_handshake_config(server.get(), shed_handshake_config);

  if (!CompleteHandshakes(client.get(), server.get())) {
    return false;
  }

  *out_client = std::move(client);
  *out_server = std::move(server);
  return true;
}